

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3Error(sqlite3 *db,int err_code,char *zFormat,...)

{
  char in_AL;
  sqlite3_value *psVar1;
  char *z;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Da;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (db != (sqlite3 *)0x0) {
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    if (db->pErr == (sqlite3_value *)0x0) {
      psVar1 = (sqlite3_value *)sqlite3DbMallocRaw(db,0x38);
      if (psVar1 == (sqlite3_value *)0x0) {
        db->pErr = (sqlite3_value *)0x0;
        return;
      }
      psVar1->n = 0;
      psVar1->flags = 0;
      psVar1->type = '\0';
      psVar1->enc = '\0';
      psVar1->xDel = (_func_void_void_ptr *)0x0;
      psVar1->db = (sqlite3 *)0x0;
      psVar1->z = (char *)0x0;
      psVar1->r = 0.0;
      (psVar1->u).i = 0;
      psVar1->zMalloc = (char *)0x0;
      psVar1->flags = 1;
      psVar1->type = '\x05';
      psVar1->db = db;
      db->pErr = psVar1;
    }
    db->errCode = err_code;
    if (zFormat == (char *)0x0) {
      if (db->pErr != (Mem *)0x0) {
        sqlite3VdbeMemSetNull(db->pErr);
        return;
      }
    }
    else {
      local_e8.reg_save_area = local_c8;
      local_e8.overflow_arg_area = &ap[0].overflow_arg_area;
      local_e8.gp_offset = 0x18;
      local_e8.fp_offset = 0x30;
      z = sqlite3VMPrintf(db,zFormat,&local_e8);
      if (db->pErr != (Mem *)0x0) {
        sqlite3VdbeMemSetStr(db->pErr,z,-1,'\x01',sqlite3MallocSize);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Error(sqlite3 *db, int err_code, const char *zFormat, ...){
  if( db && (db->pErr || (db->pErr = sqlite3ValueNew(db))!=0) ){
    db->errCode = err_code;
    if( zFormat ){
      char *z;
      va_list ap;
      va_start(ap, zFormat);
      z = sqlite3VMPrintf(db, zFormat, ap);
      va_end(ap);
      sqlite3ValueSetStr(db->pErr, -1, z, SQLITE_UTF8, SQLITE_DYNAMIC);
    }else{
      sqlite3ValueSetStr(db->pErr, 0, 0, SQLITE_UTF8, SQLITE_STATIC);
    }
  }
}